

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_matrix_t *
parasail_matrix_create_internal(char *alphabet,int match,int mismatch,int case_sensitive)

{
  long lVar1;
  byte bVar2;
  size_t i;
  size_t __n;
  int *piVar3;
  int *piVar4;
  long lVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  parasail_matrix_t *ppVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  char *__size;
  
  if (alphabet == (char *)0x0) {
    pcVar7 = "%s: missing %s\n";
    __size = "alphabet";
  }
  else {
    __n = strlen(alphabet);
    if (0x7ffffffe < __n) {
      fprintf(_stderr,"%s: alphabet is too large\n","parasail_matrix_create_internal");
      return (parasail_matrix_t *)0x0;
    }
    lVar1 = __n + 1;
    __size = (char *)(lVar1 * lVar1 * 4);
    piVar3 = (int *)malloc((size_t)__size);
    if (piVar3 == (int *)0x0) {
      pcVar7 = "%s: failed to malloc %zu bytes\n";
    }
    else {
      lVar5 = 0;
      for (sVar9 = 0; sVar9 != __n; sVar9 = sVar9 + 1) {
        for (sVar10 = 0; __n != sVar10; sVar10 = sVar10 + 1) {
          iVar11 = mismatch;
          if (sVar9 == sVar10) {
            iVar11 = match;
          }
          piVar3[lVar5 + sVar10] = iVar11;
        }
        piVar3[lVar5 + sVar10] = 0;
        lVar5 = lVar5 + sVar10 + 1;
      }
      for (sVar9 = 0xffffffffffffffff; __n != sVar9; sVar9 = sVar9 + 1) {
        piVar3[lVar5 + sVar9 + 1] = 0;
      }
      piVar4 = (int *)malloc(0x400);
      if (piVar4 == (int *)0x0) {
        pcVar7 = "%s: failed to malloc %zu bytes\n";
        __size = (char *)0x400;
      }
      else {
        for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
          piVar4[lVar5] = (int)__n;
        }
        if (case_sensitive == 0) {
          for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
            pp_Var6 = __ctype_toupper_loc();
            bVar2 = alphabet[sVar9];
            piVar4[(*pp_Var6)[bVar2]] = (int)sVar9;
            pp_Var6 = __ctype_tolower_loc();
            piVar4[(*pp_Var6)[bVar2]] = (int)sVar9;
          }
        }
        else {
          for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
            piVar4[(byte)alphabet[sVar9]] = (int)sVar9;
          }
        }
        __size = (char *)(__n + 2);
        pcVar7 = (char *)malloc((size_t)__size);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "%s: failed to malloc %zu bytes\n";
        }
        else {
          memcpy(pcVar7,alphabet,__n);
          (pcVar7 + __n)[0] = '*';
          (pcVar7 + __n)[1] = '\0';
          ppVar8 = (parasail_matrix_t *)malloc(0x48);
          if (ppVar8 != (parasail_matrix_t *)0x0) {
            ppVar8->name = "";
            ppVar8->matrix = piVar3;
            ppVar8->mapper = piVar4;
            ppVar8->size = (int)lVar1;
            iVar11 = mismatch;
            if (mismatch < match) {
              iVar11 = match;
            }
            ppVar8->max = iVar11;
            if (match < mismatch) {
              mismatch = match;
            }
            ppVar8->min = mismatch;
            ppVar8->user_matrix = piVar3;
            ppVar8->type = 0;
            ppVar8->length = (int)lVar1;
            ppVar8->alphabet = pcVar7;
            ppVar8->query = (char *)0x0;
            return ppVar8;
          }
          pcVar7 = "%s: failed to malloc %zu bytes\n";
          __size = (char *)0x48;
        }
      }
    }
  }
  fprintf(_stderr,pcVar7,"parasail_matrix_create_internal",__size);
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_create_internal(
        const char *alphabet, const int match, const int mismatch, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    int *mapper = NULL;
    char *alphabet_copy = NULL;
    size_t size = 0;
    size_t size1 = 0;
    size_t i = 0;
    size_t j = 0;
    size_t c = 0;

    PARASAIL_CHECK_NULL(alphabet);

    size = strlen(alphabet);
    if (size >= INT_MAX) {
        fprintf(stderr, "%s: alphabet is too large\n", __func__);
        return NULL;
    }
    size1 = size + 1;

    PARASAIL_CALLOC(matrix, int, size1*size1);

    for (i=0; i<size; ++i) {
        for (j=0; j<size; ++j) {
            if (i == j) {
                matrix[c++] = match;
            }
            else {
                matrix[c++] = mismatch;
            }
        }
        matrix[c++] = 0;
    }
    for (j=0; j<size1; ++j) {
        matrix[c++] = 0;
    }

    PARASAIL_CALLOC(mapper, int, 256);
    parasail_memset_int(mapper, (int)size, 256);
    if (case_sensitive) {
        for (i=0; i<size; ++i) {
            mapper[(unsigned char)alphabet[i]] = (int)i;
        }
    }
    else {
        for (i=0; i<size; ++i) {
            mapper[toupper((unsigned char)alphabet[i])] = (int)i;
            mapper[tolower((unsigned char)alphabet[i])] = (int)i;
        }
    }

    PARASAIL_CALLOC(alphabet_copy, char, size1+1);
    (void)memcpy(alphabet_copy, alphabet, sizeof(char) * size);
    alphabet_copy[size] = '*';
    alphabet_copy[size1] = '\0';

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = "";
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)size1;
    retval->max = match > mismatch ? match : mismatch;
    retval->min = match > mismatch ? mismatch : match;
    retval->user_matrix = matrix;
    retval->type = PARASAIL_MATRIX_TYPE_SQUARE;
    retval->length = retval->size;
    retval->alphabet = alphabet_copy;
    retval->query = NULL;
    return retval;
}